

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_error.cc
# Opt level: O0

void PF_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  RC rc_local;
  
  if ((rc < 1) || (9 < rc)) {
    if ((-rc < 1) || (10 < -rc)) {
      if (rc == -0xb) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar1 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::operator<<(poVar1,"\n");
      }
      else if (rc == 0) {
        std::operator<<((ostream *)&std::cerr,"PF_PrintError called with return code of 0\n");
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cerr,"PF error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
        std::operator<<(poVar1," is out of bounds\n");
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"PF error: ");
      poVar1 = std::operator<<(poVar1,PF_ErrorMsg[-1 - rc]);
      std::operator<<(poVar1,"\n");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"PF warning: ");
    poVar1 = std::operator<<(poVar1,PF_WarnMsg[rc + -1]);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void PF_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_PF_WARN && rc <= PF_LASTWARN)
    // Print warning
    cerr << "PF warning: " << PF_WarnMsg[rc - START_PF_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_PF_ERR && -rc < -PF_LASTERROR)
    // Print error
    cerr << "PF error: " << PF_ErrorMsg[-rc + START_PF_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "PF_PrintError called with return code of 0\n";
  else
    cerr << "PF error: " << rc << " is out of bounds\n";
}